

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip.c
# Opt level: O1

_Bool lrtr_ip_str_cmp(lrtr_ip_addr *addr1,char *addr2)

{
  undefined8 uVar1;
  _Bool _Var2;
  int iVar3;
  long in_FS_OFFSET;
  bool bVar4;
  lrtr_ip_addr tmp;
  lrtr_ip_addr local_60;
  undefined1 local_48 [8];
  undefined8 uStack_40;
  uint32_t local_38;
  lrtr_ip_addr local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = lrtr_ip_str_to_addr(addr2,&local_60);
  if (iVar3 != -1) {
    local_38 = (addr1->u).addr6.addr[3];
    local_48 = *(undefined1 (*) [8])addr1;
    uStack_40 = *(undefined8 *)((long)&addr1->u + 4);
    local_28._0_8_ = local_60._0_8_;
    uVar1 = local_28._0_8_;
    local_28.u._4_8_ = local_60.u._4_8_;
    local_28.u.addr6.addr[3] = local_60.u.addr6.addr[3];
    local_28.ver = local_60.ver;
    bVar4 = local_48._0_4_ == local_28.ver;
    local_28._0_8_ = uVar1;
    if (bVar4) {
      if (local_48._0_4_ == LRTR_IPV6) {
        _Var2 = lrtr_ipv6_addr_equal((lrtr_ipv6_addr *)(local_48 + 4),&local_28.u.addr6);
      }
      else {
        _Var2 = lrtr_ipv4_addr_equal((lrtr_ipv4_addr *)(local_48 + 4),&local_28.u.addr4);
      }
      goto LAB_001052a4;
    }
  }
  _Var2 = false;
LAB_001052a4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return _Var2;
  }
  __stack_chk_fail();
}

Assistant:

RTRLIB_EXPORT bool lrtr_ip_str_cmp(const struct lrtr_ip_addr *addr1, const char *addr2)
{
	struct lrtr_ip_addr tmp;

	if (lrtr_ip_str_to_addr(addr2, &tmp) == -1)
		return false;
	return lrtr_ip_addr_equal(*addr1, tmp);
}